

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O0

void __thiscall AFastProjectile::Tick(AFastProjectile *this)

{
  double *pdVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  FState *newstate;
  double dVar7;
  double dVar8;
  TFlags<ActorFlag3,_unsigned_int> local_194;
  TFlags<ActorFlag3,_unsigned_int> local_190;
  undefined4 local_18c;
  DVector3 local_188;
  TVector2<double> local_170;
  FTextureID local_160;
  TFlags<ActorFlag3,_unsigned_int> local_15c;
  DVector3 local_158;
  TVector3<double> local_140;
  TVector2<double> local_128;
  int local_114;
  undefined1 local_110 [4];
  int ripcount;
  int local_e8;
  TFlags<ActorFlag2,_unsigned_int> local_e4;
  int count;
  FCheckPosition tm;
  double oldz;
  undefined1 auStack_30 [4];
  int changexy;
  DVector3 frac;
  int i;
  AFastProjectile *this_local;
  
  TVector3<double>::TVector3((TVector3<double> *)auStack_30);
  AActor::ClearInterpolation(&this->super_AActor);
  AActor::Z(&this->super_AActor);
  iVar3 = (int)this;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            ((TFlags<ActorFlag5,_unsigned_int> *)&tm.PushTime,
             iVar3 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|
                     MF5_NODROPOFF));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&tm.PushTime);
  if (uVar6 == 0) {
    if ((bglobal._16_1_ & 1) != 0) {
      return;
    }
    if ((::level.flags2 & 0x20) != 0) {
      return;
    }
  }
  TFlags<ActorFlag2,_unsigned_int>::operator&(&local_e4,iVar3 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
  FCheckPosition::FCheckPosition((FCheckPosition *)&count,uVar6 != 0);
  local_e8 = 8;
  if (0.0 < (this->super_AActor).radius) {
    while( true ) {
      bVar4 = true;
      if (ABS((this->super_AActor).Vel.X) <= (this->super_AActor).radius * (double)local_e8) {
        bVar4 = (this->super_AActor).radius * (double)local_e8 < ABS((this->super_AActor).Vel.Y);
      }
      if (!bVar4) break;
      local_e8 = local_e8 * 2;
    }
  }
  bVar4 = TVector3<double>::isZero(&(this->super_AActor).Vel);
  if (bVar4) {
    dVar8 = AActor::Z(&this->super_AActor);
    pdVar1 = &(this->super_AActor).floorz;
    if ((dVar8 == *pdVar1) && (!NAN(dVar8) && !NAN(*pdVar1))) goto LAB_007e6740;
  }
  TVector3<double>::operator/
            ((TVector3<double> *)local_110,&(this->super_AActor).Vel,(double)local_e8);
  TVector3<double>::operator=((TVector3<double> *)auStack_30,(TVector3<double> *)local_110);
  bVar4 = true;
  if ((_auStack_30 == 0.0) && (!NAN(_auStack_30))) {
    bVar4 = frac.X != 0.0;
  }
  local_114 = local_e8 / 8;
  for (frac.Z._4_4_ = 0; frac.Z._4_4_ < local_e8; frac.Z._4_4_ = frac.Z._4_4_ + 1) {
    if (bVar4) {
      local_114 = local_114 + -1;
      if (local_114 < 1) {
        TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::Clear
                  ((TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *)&tm.stepthing
                   ,1);
      }
      AActor::Pos(&local_158,&this->super_AActor);
      TVector3<double>::operator+(&local_140,&local_158,(TVector3<double> *)auStack_30);
      TVector2<double>::TVector2(&local_128,&local_140);
      bVar5 = P_TryMove(&this->super_AActor,&local_128,1,(secplane_t *)0x0,(FCheckPosition *)&count,
                        false);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_15c,
                   iVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_15c);
        if (uVar6 == 0) {
          bVar4 = false;
          if ((tm._96_8_ != 0) && (bVar4 = false, *(long *)(tm._96_8_ + 0x80) != 0)) {
            local_160 = sector_t::GetTexture(*(sector_t **)(tm._96_8_ + 0x80),1);
            bVar5 = FTextureID::operator==(&local_160,&skyflatnum);
            bVar4 = false;
            if (bVar5) {
              dVar8 = AActor::Z(&this->super_AActor);
              lVar2 = *(long *)(tm._96_8_ + 0x80);
              AActor::PosRelative(&local_188,&this->super_AActor,(line_t *)tm._96_8_);
              TVector2<double>::TVector2(&local_170,&local_188);
              dVar7 = secplane_t::ZatPoint((secplane_t *)(lVar2 + 0xd8),&local_170);
              bVar4 = dVar7 <= dVar8;
            }
          }
          if (bVar4) {
            (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            local_18c = 1;
            goto LAB_007e6823;
          }
          if (((this->super_AActor).BlockingLine != (line_t *)0x0) &&
             (((this->super_AActor).BlockingLine)->special == 9)) {
            (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            local_18c = 1;
            goto LAB_007e6823;
          }
        }
        P_ExplodeMissile(&this->super_AActor,(this->super_AActor).BlockingLine,
                         (this->super_AActor).BlockingMobj);
        local_18c = 1;
        goto LAB_007e6823;
      }
    }
    AActor::AddZ(&this->super_AActor,frac.Y,true);
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x24])(this,1);
    dVar8 = AActor::Z(&this->super_AActor);
    if (dVar8 <= (this->super_AActor).floorz) {
      bVar5 = FTextureID::operator==(&(this->super_AActor).floorpic,&skyflatnum);
      bVar4 = false;
      if (bVar5) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_190,
                   iVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_190);
        bVar4 = uVar6 == 0;
      }
      if (bVar4) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        local_18c = 1;
      }
      else {
        AActor::SetZ(&this->super_AActor,(this->super_AActor).floorz,true);
        P_HitFloor(&this->super_AActor);
        P_ExplodeMissile(&this->super_AActor,(line_t *)0x0,(AActor *)0x0);
        local_18c = 1;
      }
      goto LAB_007e6823;
    }
    dVar8 = AActor::Top(&this->super_AActor);
    pdVar1 = &(this->super_AActor).ceilingz;
    if (*pdVar1 <= dVar8 && dVar8 != *pdVar1) {
      bVar5 = FTextureID::operator==(&(this->super_AActor).ceilingpic,&skyflatnum);
      bVar4 = false;
      if (bVar5) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_194,
                   iVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_194);
        bVar4 = uVar6 == 0;
      }
      if (bVar4) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        local_18c = 1;
      }
      else {
        AActor::SetZ(&this->super_AActor,(this->super_AActor).ceilingz - (this->super_AActor).Height
                     ,true);
        P_ExplodeMissile(&this->super_AActor,(line_t *)0x0,(AActor *)0x0);
        local_18c = 1;
      }
      goto LAB_007e6823;
    }
    if ((bVar4) && (local_114 < 1)) {
      local_114 = local_e8 >> 3;
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
    }
  }
LAB_007e6740:
  bVar4 = AActor::CheckNoDelay(&this->super_AActor);
  if (bVar4) {
    if ((this->super_AActor).tics == -1) {
LAB_007e6819:
      local_18c = 0;
    }
    else {
      if (0 < (this->super_AActor).tics) {
        (this->super_AActor).tics = (this->super_AActor).tics + -1;
      }
      do {
        if ((this->super_AActor).tics != 0) goto LAB_007e6819;
        newstate = FState::GetNextState((this->super_AActor).state);
        bVar4 = AActor::SetState(&this->super_AActor,newstate,false);
      } while (bVar4);
      local_18c = 1;
    }
  }
  else {
    local_18c = 1;
  }
LAB_007e6823:
  FCheckPosition::~FCheckPosition((FCheckPosition *)&count);
  return;
}

Assistant:

void AFastProjectile::Tick ()
{
	int i;
	DVector3 frac;
	int changexy;

	ClearInterpolation();
	double oldz = Z();

	if (!(flags5 & MF5_NOTIMEFREEZE))
	{
		//Added by MC: Freeze mode.
		if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
		{
			return;
		}
	}


	// [RH] Ripping is a little different than it was in Hexen
	FCheckPosition tm(!!(flags2 & MF2_RIP));

	int count = 8;
	if (radius > 0)
	{
		while ( fabs(Vel.X) > radius * count || fabs(Vel.Y) > radius * count)
		{
			// we need to take smaller steps.
			count += count;
		}
	}

	// Handle movement
	if (!Vel.isZero() || (Z() != floorz))
	{
		frac = Vel / count;
		changexy = frac.X != 0 || frac.Y != 0;
		int ripcount = count / 8;
		for (i = 0; i < count; i++)
		{
			if (changexy)
			{
				if (--ripcount <= 0)
				{
					tm.LastRipped.Clear();	// [RH] Do rip damage each step, like Hexen
				}
				
				if (!P_TryMove (this, Pos() + frac, true, NULL, tm))
				{ // Blocked move
					if (!(flags3 & MF3_SKYEXPLODE))
					{
						if (tm.ceilingline &&
							tm.ceilingline->backsector &&
							tm.ceilingline->backsector->GetTexture(sector_t::ceiling) == skyflatnum &&
							Z() >= tm.ceilingline->backsector->ceilingplane.ZatPoint(PosRelative(tm.ceilingline)))
						{
							// Hack to prevent missiles exploding against the sky.
							// Does not handle sky floors.
							Destroy ();
							return;
						}
						// [RH] Don't explode on horizon lines.
						if (BlockingLine != NULL && BlockingLine->special == Line_Horizon)
						{
							Destroy ();
							return;
						}
					}

					P_ExplodeMissile (this, BlockingLine, BlockingMobj);
					return;
				}
			}
			AddZ(frac.Z);
			UpdateWaterLevel ();
			oldz = Z();
			if (oldz <= floorz)
			{ // Hit the floor

				if (floorpic == skyflatnum && !(flags3 & MF3_SKYEXPLODE))
				{
					// [RH] Just remove the missile without exploding it
					//		if this is a sky floor.
					Destroy ();
					return;
				}

				SetZ(floorz);
				P_HitFloor (this);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (Top() > ceilingz)
			{ // Hit the ceiling

				if (ceilingpic == skyflatnum &&  !(flags3 & MF3_SKYEXPLODE))
				{
					Destroy ();
					return;
				}

				SetZ(ceilingz - Height);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (changexy && ripcount <= 0) 
			{
				ripcount = count >> 3;
				Effect();
			}
		}
	}
	if (!CheckNoDelay())
		return;		// freed itself
	// Advance the state
	if (tics != -1)
	{
		if (tics > 0) tics--;
		while (!tics)
		{
			if (!SetState (state->GetNextState ()))
			{ // mobj was removed
				return;
			}
		}
	}
}